

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.h
# Opt level: O0

void __thiscall
spvtools::opt::Function::AddBasicBlock
          (Function *this,
          unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> *b,
          iterator ip)

{
  pointer this_00;
  unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> local_30;
  unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> *local_28;
  unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> *b_local;
  Function *this_local;
  iterator ip_local;
  
  ip_local.container_ = (UptrVector *)ip.iterator_._M_current;
  this_local = (Function *)ip.container_;
  local_28 = b;
  b_local = (unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
             *)this;
  this_00 = std::
            unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>::
            operator->(b);
  BasicBlock::SetParent(this_00,this);
  std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>::
  unique_ptr(&local_30,b);
  UptrVectorIterator<spvtools::opt::BasicBlock,_false>::InsertBefore<false>
            ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&this_local,&local_30);
  std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>::
  ~unique_ptr(&local_30);
  return;
}

Assistant:

inline void Function::AddBasicBlock(std::unique_ptr<BasicBlock> b,
                                    iterator ip) {
  b->SetParent(this);
  ip.InsertBefore(std::move(b));
}